

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O2

Abc_Obj_t * Abc_AigAndLookup(Abc_Aig_t *pMan,Abc_Obj_t *p0,Abc_Obj_t *p1)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t **ppAVar6;
  
  pAVar5 = (Abc_Obj_t *)((ulong)p0 & 0xfffffffffffffffe);
  if ((Abc_Aig_t *)pAVar5->pNtk->pManFunc != pMan) {
    __assert_fail("Abc_ObjRegular(p0)->pNtk->pManFunc == pMan",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                  ,0x197,"Abc_Obj_t *Abc_AigAndLookup(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *)");
  }
  pAVar4 = (Abc_Obj_t *)((ulong)p1 & 0xfffffffffffffffe);
  if ((Abc_Aig_t *)pAVar4->pNtk->pManFunc == pMan) {
    pAVar2 = Abc_AigConst1(pMan->pNtkAig);
    pAVar3 = p0;
    if (p0 != p1) {
      if ((Abc_Obj_t *)((ulong)p1 ^ 1) == p0) {
        pAVar3 = (Abc_Obj_t *)((ulong)pAVar2 ^ 1);
      }
      else if (pAVar2 == pAVar5) {
        pAVar3 = p1;
        if (pAVar5 != p0) {
          pAVar3 = (Abc_Obj_t *)((ulong)p0 | 1);
        }
      }
      else if (pAVar2 == pAVar4) {
        if (pAVar4 != p1) {
          pAVar3 = (Abc_Obj_t *)((ulong)p1 | 1);
        }
      }
      else {
        pAVar3 = (Abc_Obj_t *)0x0;
        if (((pAVar5->vFanouts).nSize != 0) && ((pAVar4->vFanouts).nSize != 0)) {
          pAVar3 = p0;
          if (pAVar4->Id < pAVar5->Id) {
            pAVar3 = p1;
            p1 = p0;
          }
          uVar1 = Abc_HashKey2(pAVar3,p1,pMan->nBins);
          ppAVar6 = pMan->pBins + uVar1;
          while (pAVar5 = *ppAVar6, pAVar5 != (Abc_Obj_t *)0x0) {
            pAVar4 = Abc_ObjChild0(pAVar5);
            if ((pAVar3 == pAVar4) && (pAVar4 = Abc_ObjChild1(pAVar5), p1 == pAVar4)) {
              return pAVar5;
            }
            ppAVar6 = &pAVar5->pNext;
          }
          pAVar3 = (Abc_Obj_t *)0x0;
        }
      }
    }
    return pAVar3;
  }
  __assert_fail("Abc_ObjRegular(p1)->pNtk->pManFunc == pMan",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcAig.c"
                ,0x198,"Abc_Obj_t *Abc_AigAndLookup(Abc_Aig_t *, Abc_Obj_t *, Abc_Obj_t *)");
}

Assistant:

Abc_Obj_t * Abc_AigAndLookup( Abc_Aig_t * pMan, Abc_Obj_t * p0, Abc_Obj_t * p1 )
{
    Abc_Obj_t * pAnd, * pConst1;
    unsigned Key;
    assert( Abc_ObjRegular(p0)->pNtk->pManFunc == pMan );
    assert( Abc_ObjRegular(p1)->pNtk->pManFunc == pMan );
    // check for trivial cases
    pConst1 = Abc_AigConst1(pMan->pNtkAig);
    if ( p0 == p1 )
        return p0;
    if ( p0 == Abc_ObjNot(p1) )
        return Abc_ObjNot(pConst1);
    if ( Abc_ObjRegular(p0) == pConst1 )
    {
        if ( p0 == pConst1 )
            return p1;
        return Abc_ObjNot(pConst1);
    }
    if ( Abc_ObjRegular(p1) == pConst1 )
    {
        if ( p1 == pConst1 )
            return p0;
        return Abc_ObjNot(pConst1);
    }
/*
    {
        int nFans0 = Abc_ObjFanoutNum( Abc_ObjRegular(p0) );
        int nFans1 = Abc_ObjFanoutNum( Abc_ObjRegular(p1) );
        if ( nFans0 == 0 || nFans1 == 0 )
            pMan->nStrash0++;
        else if ( nFans0 == 1 || nFans1 == 1 )
            pMan->nStrash1++;
        else if ( nFans0 <= 100 && nFans1 <= 100 )
            pMan->nStrash5++;
        else
            pMan->nStrash2++;
    }
*/
    {
        int nFans0 = Abc_ObjFanoutNum( Abc_ObjRegular(p0) );
        int nFans1 = Abc_ObjFanoutNum( Abc_ObjRegular(p1) );
        if ( nFans0 == 0 || nFans1 == 0 )
            return NULL;
    }

    // order the arguments
    if ( Abc_ObjRegular(p0)->Id > Abc_ObjRegular(p1)->Id )
        pAnd = p0, p0 = p1, p1 = pAnd;
    // get the hash key for these two nodes
    Key = Abc_HashKey2( p0, p1, pMan->nBins );
    // find the matching node in the table
    Abc_AigBinForEachEntry( pMan->pBins[Key], pAnd )
        if ( p0 == Abc_ObjChild0(pAnd) && p1 == Abc_ObjChild1(pAnd) )
        {
//            assert( Abc_ObjFanoutNum(Abc_ObjRegular(p0)) && Abc_ObjFanoutNum(p1) );
             return pAnd;
        }
    return NULL;
}